

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::join
          (Vector<wasm::analysis::Bool> *this,Element *joinee,Element *joiner)

{
  uint __line;
  const_reference cVar1;
  bool bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  char *__assertion;
  bool bVar4;
  ulong __n;
  undefined8 uStack_38;
  
  uVar3 = (ulong)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  if (uVar3 == this->size) {
    if ((ulong)(joiner->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(joiner->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_p -
        (long)(joiner->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p) * 8 == uVar3) {
      bVar4 = false;
      uStack_38 = in_RAX;
      for (__n = 0; __n < uVar3; __n = __n + 1) {
        cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](joiner,__n);
        uStack_38 = CONCAT17(cVar1,(undefined7)uStack_38);
        bVar2 = joinAtIndex(this,joinee,__n,(Element *)((long)&uStack_38 + 7));
        bVar4 = (bool)(bVar4 | bVar2);
        uVar3 = this->size;
      }
      return bVar4;
    }
    __assertion = "joiner.size() == size";
    __line = 0x55;
  }
  else {
    __assertion = "joinee.size() == size";
    __line = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,__line,
                "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const Element &) const [L = wasm::analysis::Bool]"
               );
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    assert(joinee.size() == size);
    assert(joiner.size() == size);
    bool result = false;
    for (size_t i = 0; i < size; ++i) {
      result |= joinAtIndex(joinee, i, joiner[i]);
    }
    return result;
  }